

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O2

void __thiscall
Arithmetic_AddLocals_Test::~Arithmetic_AddLocals_Test(Arithmetic_AddLocals_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Arithmetic, AddLocals) {
	// let a = 0 while true { a = a + b }
	MOCK(
		BC3(BC_ADD_LL, 0, 0, 1),
	);

	INS(IR_LOAD_STACK, 0, 0);
	INS(IR_LOAD_STACK, 1, 0);
	INS(IR_ADD, 1, 2);
}